

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

bool __thiscall
obx::Box<objectbox::tsdemo::NamedTimeRange>::get
          (Box<objectbox::tsdemo::NamedTimeRange> *this,obx_id id,NamedTimeRange *outObject)

{
  Store *store;
  bool bVar1;
  obx_schema_id entityId;
  size_t local_60;
  size_t size;
  void *data;
  CursorTx ctx;
  NamedTimeRange *outObject_local;
  obx_id id_local;
  Box<objectbox::tsdemo::NamedTimeRange> *this_local;
  
  store = (this->super_BoxTypeless).store_;
  ctx.cCursor_ = (OBX_cursor *)outObject;
  entityId = objectbox::tsdemo::NamedTimeRange::_OBX_MetaInfo::entityId();
  anon_unknown_3::CursorTx::CursorTx((CursorTx *)&data,READ,store,entityId);
  bVar1 = BoxTypeless::get(&this->super_BoxTypeless,(CursorTx *)&data,id,(void **)&size,&local_60);
  if (bVar1) {
    objectbox::tsdemo::NamedTimeRange::_OBX_MetaInfo::fromFlatBuffer
              ((void *)size,local_60,(NamedTimeRange *)ctx.cCursor_);
  }
  anon_unknown_3::CursorTx::~CursorTx((CursorTx *)&data);
  return bVar1;
}

Assistant:

bool get(obx_id id, EntityT& outObject) {
        CursorTx ctx(TxMode::READ, store_, EntityBinding::entityId());
        const void* data;
        size_t size;
        if (!get(ctx, id, &data, &size)) return false;
        EntityBinding::fromFlatBuffer(data, size, outObject);
        return true;
    }